

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O1

int ndn_name_append_name(ndn_name_t *lhs,ndn_name_t *rhs)

{
  name_component_t *pnVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint8_t *puVar7;
  uint32_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  int iVar13;
  ndn_name_t *pnVar14;
  ulong uVar15;
  
  iVar13 = -10;
  if ((uint)rhs->components_size + (uint)lhs->components_size < 0xb) {
    if (rhs->components_size == '\0') {
      return 0;
    }
    iVar13 = 0;
    uVar15 = 0;
    pnVar14 = rhs;
    do {
      bVar2 = lhs->components_size;
      uVar8 = pnVar14->components[0].type;
      uVar9 = pnVar14->components[0].value[0];
      uVar10 = pnVar14->components[0].value[1];
      uVar11 = pnVar14->components[0].value[2];
      uVar12 = pnVar14->components[0].value[3];
      uVar3 = *(undefined8 *)(pnVar14->components[0].value + 4);
      uVar4 = *(undefined8 *)(pnVar14->components[0].value + 0xc);
      uVar5 = *(undefined8 *)(pnVar14->components[0].value + 0x14);
      uVar6 = *(undefined8 *)(pnVar14->components[0].value + 0x20);
      puVar7 = lhs->components[bVar2].value;
      *(undefined8 *)(puVar7 + 0x18) = *(undefined8 *)(pnVar14->components[0].value + 0x18);
      *(undefined8 *)(puVar7 + 0x20) = uVar6;
      puVar7 = lhs->components[bVar2].value;
      *(undefined8 *)(puVar7 + 0xc) = uVar4;
      *(undefined8 *)(puVar7 + 0x14) = uVar5;
      pnVar1 = lhs->components + bVar2;
      pnVar1->type = uVar8;
      pnVar1->value[0] = uVar9;
      pnVar1->value[1] = uVar10;
      pnVar1->value[2] = uVar11;
      pnVar1->value[3] = uVar12;
      *(undefined8 *)(pnVar1->value + 4) = uVar3;
      lhs->components_size = lhs->components_size + '\x01';
      uVar15 = uVar15 + 1;
      pnVar14 = (ndn_name_t *)(pnVar14->components + 1);
    } while (uVar15 < rhs->components_size);
  }
  return iVar13;
}

Assistant:

int
ndn_name_append_name(ndn_name_t* lhs, const ndn_name_t* rhs)
{
  if (lhs->components_size + rhs->components_size <= NDN_NAME_COMPONENTS_SIZE) {
    for (int i = 0; i < rhs->components_size; i++) {
      memcpy(&lhs->components[lhs->components_size], &rhs->components[i], sizeof(name_component_t));
      lhs->components_size++;
    }
    return 0;
  }
  else
    return NDN_OVERSIZE;
}